

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSvd2x2.h
# Opt level: O3

void Eigen::internal::real_2x2_jacobi_svd<Eigen::Matrix<float,3,3,0,3,3>,float,long>
               (Matrix<float,_3,_3,_0,_3,_3> *matrix,long p,long q,JacobiRotation<float> *j_left,
               JacobiRotation<float> *j_right)

{
  JacobiRotation<float> JVar1;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Matrix<float,_2,_2,_0,_2,_2> m;
  Matrix<float,_2,_2,_0,_2,_2> local_88;
  float local_74;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_70;
  float local_50;
  float local_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  local_70.m_xpr = &local_88;
  local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
       [p * 4];
  local_70.m_row = 0;
  local_70.m_col = 1;
  local_70.m_currentBlockRows = 1;
  local_74 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 3 + p];
  pCVar2 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(&local_70,&local_74);
  local_4c = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[p * 3 + q];
  pCVar2 = CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar2,&local_4c);
  local_50 = (matrix->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>).m_storage.m_data.
             array[q * 4];
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar2,&local_50);
  if ((local_70.m_currentBlockRows + local_70.m_row == 2) && (local_70.m_col == 2)) {
    if (1.1754944e-38 <=
        ABS(local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[1] -
            local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
            array[2])) {
      fVar3 = (local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[3] +
              local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[0]) /
              (local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[1] -
              local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[2]);
      auVar6._4_4_ = 0x3f800000;
      auVar6._0_4_ = fVar3;
      auVar6._8_8_ = 0;
      fVar3 = SQRT(fVar3 * fVar3 + 1.0);
      auVar7._4_4_ = fVar3;
      auVar7._0_4_ = fVar3;
      auVar7._8_4_ = fVar3;
      auVar7._12_4_ = fVar3;
      auVar7 = divps(auVar6,auVar7);
      uVar5 = auVar7._0_8_;
    }
    else {
      uVar5 = 0x3f800000;
    }
    local_38 = (float)uVar5;
    local_48 = (float)((ulong)uVar5 >> 0x20);
    if ((((local_38 != 1.0) || (NAN(local_38))) || (local_48 != 0.0)) || (NAN(local_48))) {
      fVar3 = local_48 *
              local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[1];
      fVar4 = local_48 *
              local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array[3];
      local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1]
           = local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[1] * local_38 -
             local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[0] * local_48;
      local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
           = local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[3] * local_38 -
             local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[2] * local_48;
      local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
           = local_38 *
             local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[0] + fVar3;
      local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
           = local_38 *
             local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
             array[2] + fVar4;
    }
    local_70.m_xpr =
         (Matrix<float,_2,_2,_0,_2,_2> *)
         CONCAT44(local_70.m_xpr._4_4_,
                  local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                  m_data.array[0]);
    local_74 = local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array[3];
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    fStack_34 = local_38;
    fStack_30 = local_38;
    fStack_2c = local_38;
    JacobiRotation<float>::makeJacobi
              (j_right,(RealScalar *)&local_70,
               local_88.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array + 2,&local_74);
    fVar3 = (*j_right).m_c;
    fVar4 = (*j_right).m_s;
    JVar1.m_s = local_38 * -fVar4 + local_48 * fVar3;
    JVar1.m_c = fStack_34 * fVar3 + fStack_44 * fVar4;
    *j_left = JVar1;
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
               );
}

Assistant:

void real_2x2_jacobi_svd(const MatrixType& matrix, Index p, Index q,
                         JacobiRotation<RealScalar> *j_left,
                         JacobiRotation<RealScalar> *j_right)
{
  using std::sqrt;
  using std::abs;
  Matrix<RealScalar,2,2> m;
  m << numext::real(matrix.coeff(p,p)), numext::real(matrix.coeff(p,q)),
       numext::real(matrix.coeff(q,p)), numext::real(matrix.coeff(q,q));
  JacobiRotation<RealScalar> rot1;
  RealScalar t = m.coeff(0,0) + m.coeff(1,1);
  RealScalar d = m.coeff(1,0) - m.coeff(0,1);

  if(abs(d) < (std::numeric_limits<RealScalar>::min)())
  {
    rot1.s() = RealScalar(0);
    rot1.c() = RealScalar(1);
  }
  else
  {
    // If d!=0, then t/d cannot overflow because the magnitude of the
    // entries forming d are not too small compared to the ones forming t.
    RealScalar u = t / d;
    RealScalar tmp = sqrt(RealScalar(1) + numext::abs2(u));
    rot1.s() = RealScalar(1) / tmp;
    rot1.c() = u / tmp;
  }
  m.applyOnTheLeft(0,1,rot1);
  j_right->makeJacobi(m,0,1);
  *j_left = rot1 * j_right->transpose();
}